

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_localtime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iValue;
  int iValue_00;
  int iValue_01;
  int iValue_02;
  int iValue_03;
  int iValue_04;
  int iValue_05;
  int iValue_06;
  int iVar1;
  tm *ptVar2;
  jx9_value *pVal;
  jx9_value *pArray;
  bool bVar3;
  time_t t;
  jx9_int64 local_48;
  int local_3c;
  jx9_context *local_38;
  
  if (nArg < 1) {
    time(&local_48);
  }
  else {
    if (((*apArg)->iFlags & 2) != 0) {
      local_48 = jx9_value_to_int64(*apArg);
      ptVar2 = localtime(&local_48);
      if (ptVar2 != (tm *)0x0) goto LAB_0012e6ba;
    }
    time(&local_48);
  }
LAB_0012e6ba:
  ptVar2 = localtime(&local_48);
  iValue = ptVar2->tm_hour;
  iValue_00 = ptVar2->tm_sec;
  iValue_01 = ptVar2->tm_min;
  iValue_02 = ptVar2->tm_mon;
  iValue_03 = ptVar2->tm_mday;
  iValue_04 = ptVar2->tm_year;
  iValue_05 = ptVar2->tm_yday;
  iValue_06 = ptVar2->tm_wday;
  iVar1 = ptVar2->tm_isdst;
  pVal = jx9_context_new_scalar(pCtx);
  if ((pVal == (jx9_value *)0x0) ||
     (local_3c = iVar1, pArray = jx9_context_new_array(pCtx), pArray == (jx9_value *)0x0)) {
    jx9_result_null(pCtx);
  }
  else {
    bVar3 = true;
    local_38 = pCtx;
    if (1 < nArg) {
      iVar1 = jx9_value_to_bool(apArg[1]);
      bVar3 = iVar1 == 0;
    }
    jx9_value_int(pVal,iValue_00);
    if (bVar3) {
      jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_sec",pVal);
    }
    jx9_value_int(pVal,iValue_01);
    if (bVar3) {
      jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_min",pVal);
    }
    jx9_value_int(pVal,iValue);
    if (bVar3) {
      jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_hour",pVal);
    }
    jx9_value_int(pVal,iValue_03);
    if (bVar3) {
      jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_mday",pVal);
    }
    jx9_value_int(pVal,iValue_02);
    if (bVar3) {
      jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_mon",pVal);
    }
    jx9_value_int(pVal,iValue_04);
    if (bVar3) {
      jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_year",pVal);
    }
    jx9_value_int(pVal,iValue_06);
    if (bVar3) {
      jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_wday",pVal);
    }
    jx9_value_int(pVal,iValue_05);
    if (bVar3) {
      jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_yday",pVal);
    }
    jx9_value_int(pVal,local_3c);
    if (bVar3) {
      jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_isdst",pVal);
    }
    jx9_result_value(local_38,pArray);
  }
  return 0;
}

Assistant:

static int jx9Builtin_localtime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pArray;
	int isAssoc = 0;
	Sytm sTm;
	if( nArg < 1 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS); /* TODO(chems): GMT not local */
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[0]) ){
			t = (time_t)jx9_value_to_int64(apArg[0]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Element value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( nArg > 1 ){
		isAssoc = jx9_value_to_bool(apArg[1]); 
	}
	/* Fill the array */
	/* Seconds */
	jx9_value_int(pValue, sTm.tm_sec);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_sec", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* Minutes */
	jx9_value_int(pValue, sTm.tm_min);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_min", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* Hours */
	jx9_value_int(pValue, sTm.tm_hour);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_hour", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* mday */
	jx9_value_int(pValue, sTm.tm_mday);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_mday", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* mon */
	jx9_value_int(pValue, sTm.tm_mon);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_mon", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* year since 1900 */
	jx9_value_int(pValue, sTm.tm_year-1900);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_year", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* wday */
	jx9_value_int(pValue, sTm.tm_wday);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_wday", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* yday */
	jx9_value_int(pValue, sTm.tm_yday);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_yday", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* isdst */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&sTm.tm_isdst);
#endif
#endif
#endif
	jx9_value_int(pValue, sTm.tm_isdst);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_isdst", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* Return the array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}